

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O1

optional<_khr_df_transfer_e> __thiscall
ktx::OptionsCreate::parseTransferFunction
          (OptionsCreate *this,ParseResult *args,char *argName,char *deprArgName,Reporter *report)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  pointer pcVar3;
  size_type sVar4;
  char *pcVar5;
  int iVar6;
  OptionValue *pOVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long lVar9;
  const_iterator cVar10;
  ulong uVar11;
  _Optional_payload_base<_khr_df_transfer_e> _Var12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_type sVar14;
  ulong uVar15;
  char *argNameToUse;
  string prefixStr;
  string transferStr;
  undefined1 local_813;
  undefined1 local_812;
  undefined1 local_811;
  char *local_810;
  string local_808;
  char *local_7e8;
  _khr_df_transfer_e local_7dc;
  char *local_7d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7d0;
  size_type local_7c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c0;
  Reporter *local_7b0;
  string local_7a8;
  _khr_df_transfer_e local_784 [39];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_6e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_6c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_698;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_670;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_648;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_620;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_5f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_5d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_5a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_580;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_558;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_530;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_508;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_4e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_4b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_490;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_468;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_440;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_418;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_378;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_350;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_58;
  
  local_7e8 = argName;
  local_7d8 = deprArgName;
  if ((parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)::
       values_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                                   ::values_abi_cxx11_), iVar6 != 0)) {
    local_808._M_dataplus._M_p = local_808._M_dataplus._M_p & 0xffffffff00000000;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              (&local_6e8,(char (*) [5])0x212469,(_khr_df_transfer_e *)&local_808);
    local_7a8._M_dataplus._M_p._0_4_ = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              (&local_6c0,(char (*) [7])"LINEAR",(_khr_df_transfer_e *)&local_7a8);
    local_810 = (char *)CONCAT44(local_810._4_4_,2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              (&local_698,(char (*) [5])"SRGB",(_khr_df_transfer_e *)&local_810);
    local_7dc = KHR_DF_TRANSFER_SCRGB;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              (&local_670,(char (*) [10])"SRGB_EOTF",&local_7dc);
    local_784[0x26] = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_648,(char (*) [6])"SCRGB",local_784 + 0x26);
    local_784[0x25] = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_620,(char (*) [11])"SCRGB_EOTF",local_784 + 0x25);
    local_784[0x24] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[4],__khr_df_transfer_e,_true>
              (&local_5f8,(char (*) [4])"ITU",local_784 + 0x24);
    local_784[0x23] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              (&local_5d0,(char (*) [9])"ITU_OETF",local_784 + 0x23);
    local_784[0x22] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_5a8,(char (*) [6])"BT601",local_784 + 0x22);
    local_784[0x21] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_580,(char (*) [11])"BT601_OETF",local_784 + 0x21);
    local_784[0x20] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_558,(char (*) [6])"BT709",local_784 + 0x20);
    local_784[0x1f] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_530,(char (*) [11])"BT709_OETF",local_784 + 0x1f);
    local_784[0x1e] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              (&local_508,(char (*) [7])"BT2020",local_784 + 0x1e);
    local_784[0x1d] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              (&local_4e0,(char (*) [12])"BT2020_OETF",local_784 + 0x1d);
    local_784[0x1c] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              (&local_4b8,(char (*) [10])"SMPTE170M",local_784 + 0x1c);
    local_784[0x1b] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[15],__khr_df_transfer_e,_true>
              (&local_490,(char (*) [15])"SMPTE170M_EOTF",local_784 + 0x1b);
    local_784[0x1a] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[15],__khr_df_transfer_e,_true>
              (&local_468,(char (*) [15])"SMPTE170M_OETF",local_784 + 0x1a);
    local_784[0x19] = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              (&local_440,(char (*) [5])"NTSC",local_784 + 0x19);
    local_784[0x18] = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              (&local_418,(char (*) [10])"NTSC_EOTF",local_784 + 0x18);
    local_784[0x17] = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              (&local_3f0,(char (*) [5])"SLOG",local_784 + 0x17);
    local_784[0x16] = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              (&local_3c8,(char (*) [10])"SLOG_OETF",local_784 + 0x16);
    local_784[0x15] = 6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_3a0,(char (*) [6])"SLOG2",local_784 + 0x15);
    local_784[0x14] = 6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_378,(char (*) [11])"SLOG2_OETF",local_784 + 0x14);
    local_784[0x13] = 7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              (&local_350,(char (*) [7])"BT1886",local_784 + 0x13);
    local_784[0x12] = 7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              (&local_328,(char (*) [12])"BT1886_EOTF",local_784 + 0x12);
    local_784[0x11] = 8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              (&local_300,(char (*) [9])"HLG_OETF",local_784 + 0x11);
    local_784[0x10] = 9;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              (&local_2d8,(char (*) [9])"HLG_EOTF",local_784 + 0x10);
    local_784[0xf] = 0xb;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[8],__khr_df_transfer_e,_true>
              (&local_2b0,(char (*) [8])"PQ_OETF",local_784 + 0xf);
    local_784[0xe] = 10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[8],__khr_df_transfer_e,_true>
              (&local_288,(char (*) [8])"PQ_EOTF",local_784 + 0xe);
    local_784[0xd] = 0xc;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_260,(char (*) [6])"DCIP3",local_784 + 0xd);
    local_784[0xc] = 0xc;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_238,(char (*) [11])"DCIP3_EOTF",local_784 + 0xc);
    local_784[0xb] = 0xd;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              (&local_210,(char (*) [9])"PAL_OETF",local_784 + 0xb);
    local_784[10] = 0xe;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              (&local_1e8,(char (*) [12])"PAL625_EOTF",local_784 + 10);
    local_784[9] = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_1c0,(char (*) [6])"ST240",local_784 + 9);
    local_784[8] = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_198,(char (*) [11])"ST240_EOTF",local_784 + 8);
    local_784[7] = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_170,(char (*) [11])"ST240_OETF",local_784 + 7);
    local_784[6] = 0x10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              (&local_148,(char (*) [7])"ACESCC",local_784 + 6);
    local_784[5] = 0x10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              (&local_120,(char (*) [12])"ACESCC_OETF",local_784 + 5);
    local_784[4] = 0x11;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[8],__khr_df_transfer_e,_true>
              (&local_f8,(char (*) [8])"ACESCCT",local_784 + 4);
    local_784[3] = 0x11;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[13],__khr_df_transfer_e,_true>
              (&local_d0,(char (*) [13])"ACESCCT_OETF",local_784 + 3);
    local_784[2] = 0x12;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              (&local_a8,(char (*) [9])"ADOBERGB",local_784 + 2);
    local_784[1] = 0x12;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[14],__khr_df_transfer_e,_true>
              (&local_80,(char (*) [14])"ADOBERGB_EOTF",local_784 + 1);
    local_784[0] = KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[22],__khr_df_transfer_e,_true>
              (&local_58,(char (*) [22])"HLG_UNNORMALIZED_OETF",local_784);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,_khr_df_transfer_e>,std::allocator<std::pair<std::__cxx11::string_const,_khr_df_transfer_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_Hashtable<std::pair<std::__cxx11::string_const,_khr_df_transfer_e>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,_khr_df_transfer_e>,std::allocator<std::pair<std::__cxx11::string_const,_khr_df_transfer_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                   ::values_abi_cxx11_,&local_6e8,&stack0xffffffffffffffd0,0,&local_811,&local_812,
               &local_813);
    lVar9 = -0x6b8;
    paVar13 = &local_58.first.field_2;
    do {
      if (paVar13 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar13->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar13->_M_allocated_capacity)[-2],
                        paVar13->_M_allocated_capacity + 1);
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar13->_M_allocated_capacity + -5);
      lVar9 = lVar9 + 0x28;
    } while (lVar9 != 0);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>_>
                 ::~unordered_map,
                 &parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                  ::values_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                         ::values_abi_cxx11_);
  }
  local_810 = (char *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,local_7e8,(allocator<char> *)&local_808);
  pOVar7 = cxxopts::ParseResult::operator[](args,&local_6e8.first);
  sVar2 = pOVar7->m_count;
  paVar13 = &local_6e8.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8.first._M_dataplus._M_p != paVar13) {
    operator_delete(local_6e8.first._M_dataplus._M_p,
                    local_6e8.first.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = local_7e8;
  if (sVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e8,local_7d8,(allocator<char> *)&local_808);
    pOVar7 = cxxopts::ParseResult::operator[](args,&local_6e8.first);
    sVar2 = pOVar7->m_count;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e8.first._M_dataplus._M_p != paVar13) {
      operator_delete(local_6e8.first._M_dataplus._M_p,
                      local_6e8.first.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = local_810;
    if (sVar2 != 0) {
      Reporter::warning<char_const(&)[85],char_const*&,char_const*&>
                (report,(char (*) [85])
                        "Option --{} is deprecated and will be removed in the next release. Use --{} instead."
                 ,&local_7d8,&local_7e8);
      pcVar5 = local_7d8;
    }
  }
  local_810 = pcVar5;
  if (local_810 == (char *)0x0) {
    _Var12._M_payload = (_Storage<_khr_df_transfer_e,_true>)0x0;
    _Var12._M_engaged = false;
    _Var12._5_3_ = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_808,local_810,(allocator<char> *)&local_7a8);
    local_7b0 = report;
    pOVar7 = cxxopts::ParseResult::operator[](args,&local_808);
    pbVar8 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar7);
    pcVar3 = (pbVar8->_M_dataplus)._M_p;
    local_7d0 = &local_7c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7d0,pcVar3,pcVar3 + pbVar8->_M_string_length);
    sVar4 = local_7c8;
    paVar1 = local_7d0;
    if (local_7c8 != 0) {
      sVar14 = 0;
      do {
        iVar6 = toupper((int)paVar1->_M_local_buf[sVar14]);
        paVar1->_M_local_buf[sVar14] = (char)iVar6;
        sVar14 = sVar14 + 1;
      } while (sVar4 != sVar14);
    }
    if (local_7d0 == &local_7c0) {
      local_6e8.first.field_2._8_8_ = local_7c0._8_8_;
      local_6e8.first._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_6e8.first._M_dataplus._M_p = (pointer)local_7d0;
    }
    local_6e8.first.field_2._M_allocated_capacity._1_7_ = local_7c0._M_allocated_capacity._1_7_;
    local_6e8.first.field_2._M_local_buf[0] = local_7c0._M_local_buf[0];
    local_6e8.first._M_string_length = local_7c8;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    paVar1 = &local_808.field_2;
    local_7d0 = &local_7c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != paVar1) {
      operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
    }
    local_808._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"KHR_DF_TRANSFER_","");
    lVar9 = std::__cxx11::string::find((char *)&local_6e8,(ulong)local_808._M_dataplus._M_p,0);
    if (lVar9 == 0) {
      if (local_6e8.first._M_string_length == local_808._M_string_length) {
        local_6e8.first._M_string_length = 0;
        *local_6e8.first._M_dataplus._M_p = '\0';
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&local_6e8,0);
      }
    }
    cVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                     ::values_abi_cxx11_._M_h,&local_6e8.first);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,local_810,(allocator<char> *)&local_7dc);
      pOVar7 = cxxopts::ParseResult::operator[](args,&local_7a8);
      pbVar8 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar7);
      Reporter::fatal_usage<char_const(&)[66],char_const*&,std::__cxx11::string_const&>
                (local_7b0,
                 (char (*) [66])
                 "Invalid or unsupported transfer specified as --{} argument: \"{}\".",&local_810,
                 pbVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_7a8._M_dataplus._M_p._4_4_,local_7a8._M_dataplus._M_p._0_4_) !=
          &local_7a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_7a8._M_dataplus._M_p._4_4_,local_7a8._M_dataplus._M_p._0_4_),
                        local_7a8.field_2._M_allocated_capacity + 1);
      }
      uVar15 = 0;
      uVar11 = 0;
    }
    else {
      uVar15 = (ulong)*(uint *)((long)cVar10.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_true>
                                      ._M_cur + 0x28);
      uVar11 = 0x100000000;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != paVar1) {
      operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e8.first._M_dataplus._M_p != paVar13) {
      operator_delete(local_6e8.first._M_dataplus._M_p,
                      local_6e8.first.field_2._M_allocated_capacity + 1);
    }
    _Var12 = (_Optional_payload_base<_khr_df_transfer_e>)(uVar11 | uVar15);
  }
  return (optional<_khr_df_transfer_e>)_Var12;
}

Assistant:

std::optional<khr_df_transfer_e> parseTransferFunction(cxxopts::ParseResult& args,
                                                  const char* argName,
                                                  const char* deprArgName,
                                                  Reporter& report) const {
        // Many of these are aliases of others. To prevent breakage, in the
        // unlikely event one is changed to not be an alias, the aliased
        // enumerator names are used.
        static const std::unordered_map<std::string, khr_df_transfer_e> values{
            { "NONE", KHR_DF_TRANSFER_UNSPECIFIED },
            { "LINEAR", KHR_DF_TRANSFER_LINEAR },
            { "SRGB", KHR_DF_TRANSFER_SRGB },
            { "SRGB_EOTF", KHR_DF_TRANSFER_SRGB_EOTF },  // SRGB
            { "SCRGB", KHR_DF_TRANSFER_SCRGB },          // SRGB
            { "SCRGB_EOTF", KHR_DF_TRANSFER_SRGB_EOTF }, // SRGB
            { "ITU", KHR_DF_TRANSFER_ITU },
            { "ITU_OETF", KHR_DF_TRANSFER_ITU_OETF },     // ITU
            { "BT601", KHR_DF_TRANSFER_BT601_OETF },      // ITU
            { "BT601_OETF", KHR_DF_TRANSFER_BT601_OETF }, // ITU
            { "BT709", KHR_DF_TRANSFER_BT709_OETF },      // ITU
            { "BT709_OETF", KHR_DF_TRANSFER_BT709_OETF }, // ITU
            { "BT2020", KHR_DF_TRANSFER_BT2020_OETF },      // ITU
            { "BT2020_OETF", KHR_DF_TRANSFER_BT2020_OETF }, // ITU
            { "SMPTE170M", KHR_DF_TRANSFER_SMTPE170M },           // ITU
            { "SMPTE170M_EOTF", KHR_DF_TRANSFER_SMTPE170M_EOTF }, // ITU
            { "SMPTE170M_OETF", KHR_DF_TRANSFER_SMTPE170M_OETF }, // ITU
            { "NTSC", KHR_DF_TRANSFER_NTSC },
            { "NTSC_EOTF", KHR_DF_TRANSFER_NTSC_EOTF },  // NTSC
            { "SLOG", KHR_DF_TRANSFER_SLOG },
            { "SLOG_OETF", KHR_DF_TRANSFER_SLOG_OETF }, // SLOG
            { "SLOG2", KHR_DF_TRANSFER_SLOG2 },
            { "SLOG2_OETF", KHR_DF_TRANSFER_SLOG2_OETF }, // SLOG2
            { "BT1886", KHR_DF_TRANSFER_BT1886 },
            { "BT1886_EOTF", KHR_DF_TRANSFER_BT1886_EOTF }, // BT1886
            { "HLG_OETF", KHR_DF_TRANSFER_HLG_OETF },
            { "HLG_EOTF", KHR_DF_TRANSFER_HLG_EOTF },
            { "PQ_OETF", KHR_DF_TRANSFER_PQ_OETF },
            { "PQ_EOTF", KHR_DF_TRANSFER_PQ_EOTF },
            { "DCIP3", KHR_DF_TRANSFER_DCIP3 },
            { "DCIP3_EOTF", KHR_DF_TRANSFER_DCIP3_EOTF }, // DCIP3
            { "PAL_OETF", KHR_DF_TRANSFER_PAL_OETF },
            { "PAL625_EOTF", KHR_DF_TRANSFER_PAL625_EOTF },
            { "ST240", KHR_DF_TRANSFER_ST240 },
            { "ST240_EOTF", KHR_DF_TRANSFER_ST240_EOTF }, // ST240
            { "ST240_OETF", KHR_DF_TRANSFER_ST240_OETF }, // ST240
            { "ACESCC", KHR_DF_TRANSFER_ACESCC },
            { "ACESCC_OETF", KHR_DF_TRANSFER_ACESCC_OETF }, // ACESCC
            { "ACESCCT", KHR_DF_TRANSFER_ACESCCT },
            { "ACESCCT_OETF", KHR_DF_TRANSFER_ACESCCT_OETF }, // ACESCCT
            { "ADOBERGB", KHR_DF_TRANSFER_ADOBERGB },
            { "ADOBERGB_EOTF", KHR_DF_TRANSFER_ADOBERGB_EOTF }, // ADOBERGB
            { "HLG_UNNORMALIZED_OETF", KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF },
        };

        std::optional<khr_df_transfer_e> result = {};
        const char* argNameToUse = nullptr;

        if (args[argName].count()) {
            argNameToUse = argName;
        } else if (args[deprArgName].count()) { // Prefer non-depcrecated name.
            report.warning("Option --{} is deprecated and will be removed in the next release. Use --{} instead.",
                           deprArgName, argName);
            argNameToUse = deprArgName;
        }

        if (argNameToUse) {
            auto transferStr = to_upper_copy(args[argNameToUse].as<std::string>());
            const std::string prefixStr = "KHR_DF_TRANSFER_";
            if (transferStr.find(prefixStr) == 0) {
                transferStr.erase(transferStr.begin(),
                                  transferStr.begin() + prefixStr.size());
            }
            const auto it = values.find(transferStr);
            if (it != values.end()) {
                result = it->second;
            } else {
                report.fatal_usage("Invalid or unsupported transfer specified as --{} argument: \"{}\".",
                                   argNameToUse, args[argNameToUse].as<std::string>());
            }
        }

        return result;
    }